

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder_test.cc
# Opt level: O0

int main(void)

{
  Director *pDVar1;
  Builder *pBVar2;
  Maze *pMVar3;
  Maze *maze;
  Director *director;
  
  pDVar1 = (Director *)operator_new(8);
  pBVar2 = (Builder *)operator_new(0x10);
  SimpleBuilder::SimpleBuilder((SimpleBuilder *)pBVar2);
  Director::Director(pDVar1,pBVar2);
  pMVar3 = Director::getMaze(pDVar1);
  if (pMVar3->level != 10) {
    __assert_fail("maze->level == 10",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/creational/builder_test.cc"
                  ,10,"int main()");
  }
  pDVar1 = (Director *)operator_new(8);
  pBVar2 = (Builder *)operator_new(0x10);
  ComplexBuilder::ComplexBuilder((ComplexBuilder *)pBVar2);
  Director::Director(pDVar1,pBVar2);
  pMVar3 = Director::getMaze(pDVar1);
  if (pMVar3->level == 100) {
    return 0;
  }
  __assert_fail("maze->level == 100",
                "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/creational/builder_test.cc"
                ,0xe,"int main()");
}

Assistant:

int main() {
  Director* director = new Director(new SimpleBuilder);
  Maze* maze = director->getMaze();
  assert(maze->level == 10);

  director = new Director(new ComplexBuilder);
  maze = director->getMaze();
  assert(maze->level == 100);
}